

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

Constraint *
slang::ast::SolveBeforeConstraint::fromSyntax
          (SolveBeforeConstraintSyntax *syntax,ASTContext *context)

{
  char *pcVar1;
  char *pcVar2;
  Compilation *this;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SolveBeforeConstraint *pSVar4;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  bool bad;
  anon_class_16_2_80a99c9f bindExprs;
  SmallVector<const_slang::ast::Expression_*,_5UL> after;
  SmallVector<const_slang::ast::Expression_*,_5UL> solve;
  char local_d1;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_d0;
  ASTContext *local_c0;
  char *local_b8;
  SmallVector<const_slang::ast::Expression_*,_5UL> local_b0;
  SmallVector<const_slang::ast::Expression_*,_5UL> local_70;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_30;
  
  local_b8 = &local_d1;
  local_d1 = '\0';
  this = ((context->scope).ptr)->compilation;
  pcVar2 = local_70.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  local_70.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  local_70.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  pcVar1 = local_b0.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  local_b0.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  local_b0.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  local_c0 = context;
  local_b0.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)pcVar1;
  local_70.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)pcVar2;
  fromSyntax(slang::syntax::SolveBeforeConstraintSyntax_const&,slang::ast::ASTContext_const&)::$_0::
  operator()(&local_c0,&syntax->beforeExpr,&local_70);
  fromSyntax(slang::syntax::SolveBeforeConstraintSyntax_const&,slang::ast::ASTContext_const&)::$_0::
  operator()(&local_c0,&syntax->afterExpr,&local_b0);
  iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (&local_70.super_SmallVectorBase<const_slang::ast::Expression_*>,
                     (EVP_PKEY_CTX *)this,src);
  local_d0._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
  iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (&local_b0.super_SmallVectorBase<const_slang::ast::Expression_*>,
                     (EVP_PKEY_CTX *)this,src_00);
  local_30._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar3);
  pSVar4 = BumpAllocator::
           emplace<slang::ast::SolveBeforeConstraint,std::span<slang::ast::Expression_const*,18446744073709551615ul>,std::span<slang::ast::Expression_const*,18446744073709551615ul>>
                     (&this->super_BumpAllocator,&local_d0,&local_30);
  if (local_d1 == '\x01') {
    local_d0._M_ptr = (pointer)pSVar4;
    pSVar4 = (SolveBeforeConstraint *)
             BumpAllocator::emplace<slang::ast::InvalidConstraint,slang::ast::Constraint_const*&>
                       (&this->super_BumpAllocator,(Constraint **)&local_d0);
  }
  if (local_b0.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ != (pointer)pcVar1) {
    operator_delete(local_b0.super_SmallVectorBase<const_slang::ast::Expression_*>.data_);
  }
  if (local_70.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ != (pointer)pcVar2) {
    operator_delete(local_70.super_SmallVectorBase<const_slang::ast::Expression_*>.data_);
  }
  return &pSVar4->super_Constraint;
}

Assistant:

Constraint& SolveBeforeConstraint::fromSyntax(const SolveBeforeConstraintSyntax& syntax,
                                              const ASTContext& context) {
    bool bad = false;
    auto bindExprs = [&](auto& list, auto& results) {
        for (auto item : list) {
            auto& expr = Expression::bind(*item, context);
            results.push_back(&expr);

            if (expr.bad()) {
                bad = true;
                continue;
            }

            auto [sym, sourceRange] = getConstraintPrimary(expr);
            if (!sym || context.getRandMode(*sym) == RandMode::None)
                context.addDiag(diag::BadSolveBefore, sourceRange);
            else if (sym && context.getRandMode(*sym) == RandMode::RandC)
                context.addDiag(diag::RandCInSolveBefore, sourceRange);
        }
    };

    auto& comp = context.getCompilation();
    SmallVector<const Expression*> solve;
    SmallVector<const Expression*> after;
    bindExprs(syntax.beforeExpr, solve);
    bindExprs(syntax.afterExpr, after);

    auto result = comp.emplace<SolveBeforeConstraint>(solve.copy(comp), after.copy(comp));
    if (bad)
        return badConstraint(comp, result);

    return *result;
}